

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_svg.hpp
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
perior::to_svg<char,std::char_traits<char>,perior::point<double,2ul>>
          (basic_ostream<char,_std::char_traits<char>_> *os,
          rectangle<perior::point<double,_2UL>_> *box,
          cubic_periodic_boundary<perior::point<double,_2UL>_> *b,string *stroke,size_t stroke_width
          ,string *fill)

{
  point_type *this;
  point_type *this_00;
  point_type *this_01;
  double dVar1;
  double dVar2;
  pointer ppVar3;
  const_reference pdVar4;
  reference pdVar5;
  double *pdVar6;
  reference pvVar7;
  ostream *poVar8;
  size_t i_5;
  size_type __n;
  size_t i;
  size_type sVar9;
  size_t i_2;
  point<double,_2UL> *xy;
  long lVar10;
  pointer this_02;
  size_t i_3;
  vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  boxes;
  pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> bx;
  point<double,_2UL> retval;
  array<double,_2UL> local_88;
  point<double,_2UL> lower;
  point<double,_2UL> upper;
  pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> splitted;
  
  boxes.
  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  boxes.
  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  boxes.
  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  ::reserve(&boxes,4);
  this = &box->radius;
  local_88.elems[0] = 0.0;
  local_88.elems[1] = 0.0;
  for (sVar9 = 0; sVar9 != 2; sVar9 = sVar9 + 1) {
    pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)box,sVar9);
    dVar1 = *pdVar4;
    pdVar4 = boost::array<double,_2UL>::operator[](&this->values_,sVar9);
    dVar2 = *pdVar4;
    pdVar5 = boost::array<double,_2UL>::operator[](&local_88,sVar9);
    *pdVar5 = dVar1 - dVar2;
  }
  this_00 = &b->upper_;
  this_01 = &b->width_;
  for (sVar9 = 0; sVar9 != 2; sVar9 = sVar9 + 1) {
    pdVar5 = boost::array<double,_2UL>::operator[](&local_88,sVar9);
    dVar1 = *pdVar5;
    pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)b,sVar9);
    if (*pdVar4 <= dVar1) {
      pdVar5 = boost::array<double,_2UL>::operator[](&local_88,sVar9);
      dVar1 = *pdVar5;
      pdVar4 = boost::array<double,_2UL>::operator[](&this_00->values_,sVar9);
      if (*pdVar4 <= dVar1) {
        pdVar4 = boost::array<double,_2UL>::operator[](&this_01->values_,sVar9);
        dVar1 = *pdVar4;
        pdVar6 = boost::array<double,_2UL>::operator[](&local_88,sVar9);
        dVar1 = *pdVar6 - dVar1;
        goto LAB_0010aef5;
      }
    }
    else {
      pdVar4 = boost::array<double,_2UL>::operator[](&this_01->values_,sVar9);
      dVar1 = *pdVar4;
      pdVar6 = boost::array<double,_2UL>::operator[](&local_88,sVar9);
      dVar1 = dVar1 + *pdVar6;
LAB_0010aef5:
      *pdVar6 = dVar1;
    }
  }
  lower.values_.elems[0] = local_88.elems[0];
  lower.values_.elems[1] = local_88.elems[1];
  retval.values_.elems[0] = 0.0;
  retval.values_.elems[1] = 0.0;
  for (sVar9 = 0; sVar9 != 2; sVar9 = sVar9 + 1) {
    pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)box,sVar9);
    dVar1 = *pdVar4;
    pdVar4 = boost::array<double,_2UL>::operator[](&this->values_,sVar9);
    dVar2 = *pdVar4;
    pdVar5 = boost::array<double,_2UL>::operator[](&retval.values_,sVar9);
    *pdVar5 = dVar1 + dVar2;
  }
  sVar9 = 0;
  do {
    if (sVar9 == 2) {
      upper.values_.elems[0] = retval.values_.elems[0];
      upper.values_.elems[1] = retval.values_.elems[1];
      for (sVar9 = 0; sVar9 != 2; sVar9 = sVar9 + 1) {
        pdVar4 = boost::array<double,_2UL>::operator[](&this->values_,sVar9);
        dVar1 = *pdVar4;
        pdVar4 = boost::array<double,_2UL>::operator[](&(b->half_width_).values_,sVar9);
        if (*pdVar4 <= dVar1) {
          pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)b,sVar9);
          dVar1 = *pdVar4;
          pdVar5 = boost::array<double,_2UL>::operator[](&lower.values_,sVar9);
          *pdVar5 = dVar1;
          pdVar4 = boost::array<double,_2UL>::operator[](&this_00->values_,sVar9);
          dVar1 = *pdVar4;
          pdVar5 = boost::array<double,_2UL>::operator[](&upper.values_,sVar9);
          *pdVar5 = dVar1;
        }
      }
      bx.first.values_.elems[0] = lower.values_.elems[0];
      bx.first.values_.elems[1] = lower.values_.elems[1];
      bx.second.values_.elems[0] = upper.values_.elems[0];
      bx.second.values_.elems[1] = upper.values_.elems[1];
      std::
      vector<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>,std::allocator<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>>>
      ::emplace_back<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>>
                ((vector<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>,std::allocator<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>>>
                  *)&boxes,&bx);
      for (sVar9 = 0;
          ppVar3 = boxes.
                   super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish, sVar9 != 2; sVar9 = sVar9 + 1) {
        lVar10 = (long)boxes.
                       super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)boxes.
                       super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        for (__n = 0; lVar10 >> 5 != __n; __n = __n + 1) {
          pvVar7 = std::
                   vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                   ::at(&boxes,__n);
          bx.first.values_.elems[0] = (pvVar7->first).values_.elems[0];
          bx.first.values_.elems[1] = (pvVar7->first).values_.elems[1];
          bx.second.values_.elems[0] = (pvVar7->second).values_.elems[0];
          bx.second.values_.elems[1] = (pvVar7->second).values_.elems[1];
          pdVar5 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&bx,sVar9);
          dVar1 = *pdVar5;
          pdVar5 = boost::array<double,_2UL>::operator[](&bx.second.values_,sVar9);
          if (*pdVar5 <= dVar1 && dVar1 != *pdVar5) {
            splitted.first.values_.elems[0] = bx.first.values_.elems[0];
            splitted.first.values_.elems[1] = bx.first.values_.elems[1];
            splitted.second.values_.elems[0] = bx.second.values_.elems[0];
            splitted.second.values_.elems[1] = bx.second.values_.elems[1];
            pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)b,sVar9);
            dVar1 = *pdVar4;
            pdVar5 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&bx,sVar9);
            *pdVar5 = dVar1;
            pdVar4 = boost::array<double,_2UL>::operator[](&this_00->values_,sVar9);
            dVar1 = *pdVar4;
            pdVar5 = boost::array<double,_2UL>::operator[](&splitted.second.values_,sVar9);
            *pdVar5 = dVar1;
            pvVar7 = std::
                     vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                     ::at(&boxes,__n);
            (pvVar7->first).values_.elems[0] = bx.first.values_.elems[0];
            (pvVar7->first).values_.elems[1] = bx.first.values_.elems[1];
            (pvVar7->second).values_.elems[0] = bx.second.values_.elems[0];
            (pvVar7->second).values_.elems[1] = bx.second.values_.elems[1];
            std::
            vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
            ::push_back(&boxes,&splitted);
          }
        }
      }
      for (this_02 = boxes.
                     super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_02 != ppVar3;
          this_02 = this_02 + 1) {
        bx.first.values_.elems[0] = 0.0;
        bx.first.values_.elems[1] = 0.0;
        for (sVar9 = 0; sVar9 != 2; sVar9 = sVar9 + 1) {
          pdVar4 = boost::array<double,_2UL>::operator[](&(this_02->second).values_,sVar9);
          dVar1 = *pdVar4;
          pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)this_02,sVar9);
          dVar2 = *pdVar4;
          pdVar5 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&bx,sVar9);
          *pdVar5 = dVar1 - dVar2;
        }
        std::operator<<(os,"<rect x = \"");
        poVar8 = std::ostream::_M_insert<double>((this_02->first).values_.elems[0]);
        std::operator<<(poVar8,"\" y = \"");
        poVar8 = std::ostream::_M_insert<double>((this_02->first).values_.elems[1]);
        std::operator<<(poVar8,"\" width = \"");
        poVar8 = std::ostream::_M_insert<double>(bx.first.values_.elems[0]);
        std::operator<<(poVar8,"\" height = \"");
        poVar8 = std::ostream::_M_insert<double>(bx.first.values_.elems[1]);
        poVar8 = std::operator<<(poVar8,"\" stroke = \"");
        poVar8 = std::operator<<(poVar8,(string *)stroke);
        poVar8 = std::operator<<(poVar8,"\" stroke-width = \"");
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        poVar8 = std::operator<<(poVar8,"\" fill = \"");
        poVar8 = std::operator<<(poVar8,(string *)fill);
        std::operator<<(poVar8,"\"/>\n");
      }
      std::
      _Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
      ::~_Vector_base(&boxes.
                       super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                     );
      return os;
    }
    pdVar5 = boost::array<double,_2UL>::operator[](&retval.values_,sVar9);
    dVar1 = *pdVar5;
    pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)b,sVar9);
    if (*pdVar4 <= dVar1) {
      pdVar5 = boost::array<double,_2UL>::operator[](&retval.values_,sVar9);
      dVar1 = *pdVar5;
      pdVar4 = boost::array<double,_2UL>::operator[](&this_00->values_,sVar9);
      if (*pdVar4 <= dVar1) {
        pdVar4 = boost::array<double,_2UL>::operator[](&this_01->values_,sVar9);
        dVar1 = *pdVar4;
        pdVar6 = boost::array<double,_2UL>::operator[](&retval.values_,sVar9);
        dVar1 = *pdVar6 - dVar1;
        goto LAB_0010b03f;
      }
    }
    else {
      pdVar4 = boost::array<double,_2UL>::operator[](&this_01->values_,sVar9);
      dVar1 = *pdVar4;
      pdVar6 = boost::array<double,_2UL>::operator[](&retval.values_,sVar9);
      dVar1 = dVar1 + *pdVar6;
LAB_0010b03f:
      *pdVar6 = dVar1;
    }
    sVar9 = sVar9 + 1;
  } while( true );
}

Assistant:

std::basic_ostream<charT, traits>&
to_svg(std::basic_ostream<charT, traits>&     os,
       const rectangle<pointT>&               box,
       const cubic_periodic_boundary<pointT>& b,
       const std::string&                     stroke       = "black",
       const std::size_t                      stroke_width = 1,
       const std::string&                     fill         = "none")
{
    BOOST_STATIC_ASSERT_MSG(
            ::perior::traits::dimension<pointT>::value == 2,
            "to_svg works only with 2-dimensional rectangle");

    // split box according to the boundary
    // here, use box
    std::vector<std::pair<pointT, pointT> > boxes; boxes.reserve(4);
    pointT lower = restrict_position(box.center - box.radius, b);
    pointT upper = restrict_position(box.center + box.radius, b);
    for(std::size_t i=0; i<2; ++i)
    {
        if(box.radius[i] >= b.half_width()[i])
        {
            lower[i] = b.lower()[i];
            upper[i] = b.upper()[i];
        }
    }

    boxes.push_back(std::make_pair(lower, upper));

    for(std::size_t dim=0; dim < 2; ++dim)
    {
        const std::size_t sz = boxes.size();
        for(std::size_t i=0; i<sz; ++i)
        {
            std::pair<pointT, pointT> bx = boxes.at(i);
            if(bx.first[dim] > bx.second[dim])
            {
                std::pair<pointT, pointT> splitted(bx);
                bx.first[dim]        = b.lower()[dim];
                splitted.second[dim] = b.upper()[dim];
                boxes.at(i) = bx;
                boxes.push_back(splitted);
            }
        }
    }

    for(typename std::vector<std::pair<pointT, pointT> >::const_iterator
            i(boxes.begin()), e(boxes.end()); i != e; ++i)
    {
        const pointT& xy = i->first;
        const pointT  rg = i->second - i->first;
        os << "<rect x = \""   << xy[0]  << "\" y = \""      << xy[1]
           << "\" width = \""  << rg[0]  << "\" height = \"" << rg[1]
           << "\" stroke = \"" << stroke << "\" stroke-width = \"" << stroke_width
           << "\" fill = \""   << fill   << "\"/>\n";
    }
    return os;
}